

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

double matd_max(matd_t *m)

{
  uint local_20;
  uint local_1c;
  int y;
  int x;
  double d;
  matd_t *m_local;
  
  y = 0xffffffff;
  x = 0xffefffff;
  for (local_1c = 0; local_1c < m->nrows; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < m->ncols; local_20 = local_20 + 1) {
      if ((double)_y < (double)m[(ulong)(local_1c * m->ncols + local_20) + 1]) {
        _y = m[(ulong)(local_1c * m->ncols + local_20) + 1];
      }
    }
  }
  return (double)_y;
}

Assistant:

double matd_max(matd_t *m)
{
    double d = -DBL_MAX;
    for(int x=0; x<m->nrows; x++) {
        for(int y=0; y<m->ncols; y++) {
            if(MATD_EL(m, x, y) > d)
                d = MATD_EL(m, x, y);
        }
    }

    return d;
}